

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_> * __thiscall
kratos::PackedStructGraph::get_structs
          (vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
           *__return_storage_ptr__,PackedStructGraph *this)

{
  bool bVar1;
  size_type __n;
  reference ppPVar2;
  iterator __first;
  iterator __last;
  _Node_iterator_base<kratos::PackedStructNode_*,_false> local_e8;
  _Node_iterator_base<kratos::PackedStructNode_*,_false> local_e0;
  PackedStructNode *local_d8;
  PackedStructNode *node;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>
  *iter;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>_>_>
  *__range1;
  undefined1 local_a0 [8];
  queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
  queue;
  unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
  visited;
  PackedStructGraph *this_local;
  vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_> *result;
  
  std::
  unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
  ::unordered_set((unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
                   *)&queue.c.
                      super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  queue<kratos::PackedStructNode*,std::deque<kratos::PackedStructNode*,std::allocator<kratos::PackedStructNode*>>>
  ::queue<std::deque<kratos::PackedStructNode*,std::allocator<kratos::PackedStructNode*>>,void>
            ((queue<kratos::PackedStructNode*,std::deque<kratos::PackedStructNode*,std::allocator<kratos::PackedStructNode*>>>
              *)local_a0);
  __end1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>_>_>
           ::begin(&this->nodes_);
  iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>
          *)std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>_>_>
            ::end(&this->nodes_);
  while (bVar1 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>,_true>
                              *)&iter), bVar1) {
    node = (PackedStructNode *)
           std::__detail::
           _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>,_false,_true>
           ::operator*(&__end1);
    local_d8 = &((reference)node)->second;
    local_e0._M_cur =
         (__node_type *)
         std::
         unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
         ::find((unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
                 *)&queue.c.
                    super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node,&local_d8);
    local_e8._M_cur =
         (__node_type *)
         std::
         unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
         ::end((unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
                *)&queue.c.
                   super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node);
    bVar1 = std::__detail::operator==(&local_e0,&local_e8);
    if (bVar1) {
      topological_sort_helper
                (this,local_d8,
                 (unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
                  *)&queue.c.
                     super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node,
                 (queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
                  *)local_a0);
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::PackedStructNode>,_false,_true>
    ::operator++(&__end1);
  }
  std::vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>::vector
            (__return_storage_ptr__);
  __n = std::
        queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
        ::size((queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
                *)local_a0);
  std::vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>::reserve
            (__return_storage_ptr__,__n);
  while (bVar1 = std::
                 queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
                 ::empty((queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
                          *)local_a0), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppPVar2 = std::
              queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
              ::front((queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
                       *)local_a0);
    std::vector<kratos::PackedStruct_const*,std::allocator<kratos::PackedStruct_const*>>::
    emplace_back<kratos::PackedStruct_const*&>
              ((vector<kratos::PackedStruct_const*,std::allocator<kratos::PackedStruct_const*>> *)
               __return_storage_ptr__,&(*ppPVar2)->struct_);
    std::
    queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
    ::pop((queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
           *)local_a0);
  }
  __first = std::vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
            ::begin(__return_storage_ptr__);
  __last = std::vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>
           ::end(__return_storage_ptr__);
  std::
  reverse<__gnu_cxx::__normal_iterator<kratos::PackedStruct_const**,std::vector<kratos::PackedStruct_const*,std::allocator<kratos::PackedStruct_const*>>>>
            ((__normal_iterator<const_kratos::PackedStruct_**,_std::vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>_>
              )__first._M_current,
             (__normal_iterator<const_kratos::PackedStruct_**,_std::vector<const_kratos::PackedStruct_*,_std::allocator<const_kratos::PackedStruct_*>_>_>
              )__last._M_current);
  std::
  queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
  ::~queue((queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
            *)local_a0);
  std::
  unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
  ::~unordered_set((unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
                    *)&queue.c.
                       super__Deque_base<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node);
  return __return_storage_ptr__;
}

Assistant:

std::vector<const PackedStruct *> PackedStructGraph::get_structs() {
    // leaf nodes need to be returned first
    std::unordered_set<PackedStructNode *> visited;
    std::queue<PackedStructNode *> queue;
    for (auto &iter : nodes_) {
        auto *node = &iter.second;
        if (visited.find(node) == visited.end()) {
            // visit it
            topological_sort_helper(this, node, visited, queue);
        }
    }
    std::vector<const PackedStruct *> result;
    result.reserve(queue.size());
    while (!queue.empty()) {
        result.emplace_back(queue.front()->struct_);
        queue.pop();
    }
    std::reverse(result.begin(), result.end());
    return result;
}